

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detour_test.cpp
# Opt level: O3

void __thiscall
detour_test_DefaultConstructor_Test::TestBody(detour_test_DefaultConstructor_Test *this)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  AssertHelperData *pAVar8;
  char *pcVar9;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  internal local_30 [8];
  undefined8 *local_28;
  
  local_38._M_head_impl = local_38._M_head_impl & 0xffffffff00000000;
  uVar4 = log_policy_format_text();
  uVar5 = log_policy_schedule_sync();
  uVar6 = log_policy_storage_sequential();
  uVar7 = log_policy_stream_stdio(_stdout);
  local_40.data_._0_4_ = log_configure_impl("metacall",4,uVar4,uVar5,uVar6,uVar7);
  testing::internal::CmpHelperEQ<int,int>
            (local_30,"(int)0",
             "(int)log_configure_impl(\"metacall\", 4, log_policy_format_text(), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_stdio(stdout))"
             ,(int *)&local_38,(int *)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/detour_test/source/detour_test.cpp"
               ,0x45,pcVar9);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  puVar1 = local_28;
  if (local_28 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_28 != local_28 + 2) {
      operator_delete((undefined8 *)*local_28);
    }
    operator_delete(puVar1);
  }
  local_38._M_head_impl = local_38._M_head_impl & 0xffffffff00000000;
  uVar2 = detour_initialize();
  local_40.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_30,"(int)0","(int)detour_initialize()",(int *)&local_38,(int *)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/detour_test/source/detour_test.cpp"
               ,0x48,pcVar9);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  puVar1 = local_28;
  if (local_28 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_28 != local_28 + 2) {
      operator_delete((undefined8 *)*local_28);
    }
    operator_delete(puVar1);
  }
  pAVar8 = (AssertHelperData *)detour_create("funchook");
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40.data_ = pAVar8;
  testing::internal::CmpHelperNE<plugin_type*,plugin_type*>
            (local_30,"(detour)__null","(detour)d",(plugin_type **)&local_38,
             (plugin_type **)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/detour_test/source/detour_test.cpp"
               ,0x4d,pcVar9);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  puVar1 = local_28;
  if (local_28 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_28 != local_28 + 2) {
      operator_delete((undefined8 *)*local_28);
    }
    operator_delete(puVar1);
  }
  local_38._M_head_impl = local_38._M_head_impl & 0xffffffff00000000;
  pcVar9 = (char *)detour_name(pAVar8);
  iVar3 = strcmp("funchook",pcVar9);
  local_40.data_._0_4_ = iVar3;
  testing::internal::CmpHelperEQ<int,int>
            (local_30,"(int)0","(int)strcmp(name, detour_name(d))",(int *)&local_38,(int *)&local_40
            );
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/detour_test/source/detour_test.cpp"
               ,0x4f,pcVar9);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  puVar1 = local_28;
  if (local_28 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_28 != local_28 + 2) {
      operator_delete((undefined8 *)*local_28);
    }
    operator_delete(puVar1);
  }
  handle = (detour_handle)detour_install(pAVar8,target_function,hook_function);
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40.data_ = (AssertHelperData *)handle;
  testing::internal::CmpHelperNE<detour_handle_type*,detour_handle_type*>
            (local_30,"(detour_handle)__null","(detour_handle)handle",
             (detour_handle_type **)&local_38,(detour_handle_type **)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/detour_test/source/detour_test.cpp"
               ,0x54,pcVar9);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  puVar1 = local_28;
  if (local_28 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_28 != local_28 + 2) {
      operator_delete((undefined8 *)*local_28);
    }
    operator_delete(puVar1);
  }
  local_38._M_head_impl._0_4_ = 0x84;
  target_function(0x80);
  local_40.data_._0_4_ = 0x80;
  testing::internal::CmpHelperEQ<int,int>
            (local_30,"(int)132","(int)target_function(128)",(int *)&local_38,(int *)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/detour_test/source/detour_test.cpp"
               ,0x57,pcVar9);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  puVar1 = local_28;
  if (local_28 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_28 != local_28 + 2) {
      operator_delete((undefined8 *)*local_28);
    }
    operator_delete(puVar1);
  }
  local_38._M_head_impl = local_38._M_head_impl & 0xffffffff00000000;
  uVar2 = detour_uninstall(pAVar8,handle);
  local_40.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_30,"(int)0","(int)detour_uninstall(d, handle)",(int *)&local_38,(int *)&local_40)
  ;
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/detour_test/source/detour_test.cpp"
               ,0x5a,pcVar9);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  puVar1 = local_28;
  if (local_28 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_28 != local_28 + 2) {
      operator_delete((undefined8 *)*local_28);
    }
    operator_delete(puVar1);
  }
  local_38._M_head_impl = local_38._M_head_impl & 0xffffffff00000000;
  uVar2 = detour_clear(pAVar8);
  local_40.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_30,"(int)0","(int)detour_clear(d)",(int *)&local_38,(int *)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/detour_test/source/detour_test.cpp"
               ,0x5d,pcVar9);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  if (local_28 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_28 != local_28 + 2) {
      operator_delete((undefined8 *)*local_28);
    }
    operator_delete(local_28);
  }
  detour_destroy();
  return;
}

Assistant:

TEST_F(detour_test, DefaultConstructor)
{
	static const char name[] = "funchook";

	/* Initialize log */
	EXPECT_EQ((int)0, (int)log_configure("metacall",
						  log_policy_format_text(),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_stdio(stdout)));

	/* Initialize detour */
	EXPECT_EQ((int)0, (int)detour_initialize());

	/* Create detour funchook */
	detour d = detour_create(name);

	EXPECT_NE((detour)NULL, (detour)d);

	EXPECT_EQ((int)0, (int)strcmp(name, detour_name(d)));

	/* Install detour */
	handle = detour_install(d, (void (*)(void)) & target_function, (void (*)(void)) & hook_function);

	EXPECT_NE((detour_handle)NULL, (detour_handle)handle);

	/* Call detour, it should call hooked function */
	EXPECT_EQ((int)132, (int)target_function(128));

	/* Uninstall detour */
	EXPECT_EQ((int)0, (int)detour_uninstall(d, handle));

	/* Clear detour */
	EXPECT_EQ((int)0, (int)detour_clear(d));

	/* Destroy detour */
	detour_destroy();
}